

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1506.c
# Opt level: O1

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  int *piVar7;
  char *pcVar8;
  int iVar9;
  long lVar10;
  timeval tVar11;
  int maxfd;
  int running;
  timeval interval;
  CURL *curl [4];
  fd_set exc;
  fd_set wr;
  fd_set rd;
  char target_url [256];
  char dnsentry [256];
  int local_400;
  int local_3fc;
  char *local_3f8;
  undefined8 local_3f0;
  timeval local_3e8;
  long local_3d8 [4];
  fd_set local_3b8;
  fd_set local_338;
  fd_set local_2b8;
  undefined1 local_238 [255];
  undefined1 local_139;
  undefined1 local_138 [264];
  
  pcVar8 = libtest_arg2;
  local_3d8[2] = 0;
  local_3d8[3] = 0;
  local_3d8[0] = 0;
  local_3d8[1] = 0;
  local_3f8 = libtest_arg3;
  iVar9 = 1;
  lVar4 = 0;
  do {
    lVar3 = lVar4;
    if (iVar9 == 5) {
      tv_test_start = tutil_tvnow();
      iVar9 = curl_global_init(3);
      uVar1 = _stderr;
      if (iVar9 == 0) {
        iVar9 = 0;
      }
      else {
        uVar5 = curl_easy_strerror(iVar9);
        curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                      ,0x3e,iVar9,uVar5);
      }
      if (iVar9 != 0) goto LAB_0010240e;
      lVar4 = curl_multi_init();
      if (lVar4 == 0) {
        curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                      ,0x40);
        iVar9 = 0x7b;
        goto LAB_00102374;
      }
      iVar2 = curl_multi_setopt(lVar4,6,3);
      uVar1 = _stderr;
      iVar9 = 0;
      if (iVar2 != 0) {
        uVar5 = curl_multi_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_multi_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                      ,0x42,iVar2,uVar5);
        iVar9 = iVar2;
      }
      if (iVar9 != 0) goto LAB_00102374;
      lVar10 = 0;
      goto LAB_001024c3;
    }
    curl_msnprintf(local_138,0x100,"server%d.example.com:%s:%s",iVar9,local_3f8,pcVar8);
    curl_mprintf("%s\n",local_138);
    lVar4 = curl_slist_append(lVar3,local_138);
    iVar9 = iVar9 + 1;
  } while (lVar4 != 0);
  lVar4 = 0;
  curl_mfprintf(_stderr,"curl_slist_append() failed\n");
  iVar9 = 0;
  goto LAB_00102374;
  while( true ) {
    iVar9 = (int)lVar10 + 1;
    curl_msnprintf(local_238,0x100,"http://server%d.example.com:%s/path/1506%04i",iVar9,local_3f8,
                   iVar9);
    local_139 = 0;
    iVar2 = curl_easy_setopt(lVar6,0x2712,local_238);
    uVar1 = _stderr;
    iVar9 = 0;
    if (iVar2 != 0) {
      uVar5 = curl_easy_strerror(iVar2);
      curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                    ,0x4d,iVar2,uVar5);
      iVar9 = iVar2;
    }
    if (iVar9 != 0) break;
    iVar2 = curl_easy_setopt(lVar6,0x29,1);
    uVar1 = _stderr;
    iVar9 = 0;
    if (iVar2 != 0) {
      uVar5 = curl_easy_strerror(iVar2);
      curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                    ,0x4f,iVar2,uVar5);
      iVar9 = iVar2;
    }
    if (iVar9 != 0) break;
    iVar2 = curl_easy_setopt(lVar6,0x2a,1);
    uVar1 = _stderr;
    iVar9 = 0;
    if (iVar2 != 0) {
      uVar5 = curl_easy_strerror(iVar2);
      curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                    ,0x51,iVar2,uVar5);
      iVar9 = iVar2;
    }
    if (iVar9 != 0) break;
    iVar2 = curl_easy_setopt(lVar6,0x27db,lVar3);
    uVar1 = _stderr;
    iVar9 = 0;
    if (iVar2 != 0) {
      uVar5 = curl_easy_strerror(iVar2);
      curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                    ,0x53,iVar2,uVar5);
      iVar9 = iVar2;
    }
    lVar10 = lVar10 + 1;
    if (iVar9 != 0) break;
LAB_001024c3:
    if (lVar10 == 4) {
      curl_mfprintf(_stderr,"Start at URL 0\n");
      pcVar8 = (char *)0x0;
      iVar9 = 0;
      goto LAB_001026e7;
    }
    lVar6 = curl_easy_init();
    local_3d8[lVar10] = lVar6;
    if (lVar6 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                    ,0x47);
      iVar9 = 0x7c;
      break;
    }
  }
  goto LAB_00102374;
  while( true ) {
    iVar9 = 0;
    do {
      local_400 = -99;
      local_3e8.tv_sec = 1;
      local_3e8.tv_usec = 0;
      iVar2 = curl_multi_perform(lVar4,&local_3fc);
      uVar1 = _stderr;
      if (iVar2 == 0) {
        if (local_3fc < 0) {
          curl_mfprintf(_stderr,
                        "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                        ,100);
          iVar9 = 0x7a;
        }
      }
      else {
        uVar5 = curl_multi_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                      ,100,iVar2,uVar5);
        iVar9 = iVar2;
      }
      iVar2 = 5;
      if (iVar9 == 0) {
        tVar11 = tutil_tvnow();
        lVar10 = tutil_tvdiff(tVar11,tv_test_start);
        if (lVar10 < 0xea61) {
          if (local_3fc == 0) {
            iVar9 = 0;
            iVar2 = 0x32;
          }
          else {
            local_2b8.__fds_bits[0xe] = 0;
            local_2b8.__fds_bits[0xf] = 0;
            local_2b8.__fds_bits[0xc] = 0;
            local_2b8.__fds_bits[0xd] = 0;
            local_2b8.__fds_bits[10] = 0;
            local_2b8.__fds_bits[0xb] = 0;
            local_2b8.__fds_bits[8] = 0;
            local_2b8.__fds_bits[9] = 0;
            local_2b8.__fds_bits[6] = 0;
            local_2b8.__fds_bits[7] = 0;
            local_2b8.__fds_bits[4] = 0;
            local_2b8.__fds_bits[5] = 0;
            local_2b8.__fds_bits[2] = 0;
            local_2b8.__fds_bits[3] = 0;
            local_2b8.__fds_bits[0] = 0;
            local_2b8.__fds_bits[1] = 0;
            local_338.__fds_bits[0] = 0;
            local_338.__fds_bits[1] = 0;
            local_338.__fds_bits[2] = 0;
            local_338.__fds_bits[3] = 0;
            local_338.__fds_bits[4] = 0;
            local_338.__fds_bits[5] = 0;
            local_338.__fds_bits[6] = 0;
            local_338.__fds_bits[7] = 0;
            local_338.__fds_bits[8] = 0;
            local_338.__fds_bits[9] = 0;
            local_338.__fds_bits[10] = 0;
            local_338.__fds_bits[0xb] = 0;
            local_338.__fds_bits[0xc] = 0;
            local_338.__fds_bits[0xd] = 0;
            local_338.__fds_bits[0xe] = 0;
            local_338.__fds_bits[0xf] = 0;
            local_3b8.__fds_bits[0] = 0;
            local_3b8.__fds_bits[1] = 0;
            local_3b8.__fds_bits[2] = 0;
            local_3b8.__fds_bits[3] = 0;
            local_3b8.__fds_bits[4] = 0;
            local_3b8.__fds_bits[5] = 0;
            local_3b8.__fds_bits[6] = 0;
            local_3b8.__fds_bits[7] = 0;
            local_3b8.__fds_bits[8] = 0;
            local_3b8.__fds_bits[9] = 0;
            local_3b8.__fds_bits[10] = 0;
            local_3b8.__fds_bits[0xb] = 0;
            local_3b8.__fds_bits[0xc] = 0;
            local_3b8.__fds_bits[0xd] = 0;
            local_3b8.__fds_bits[0xe] = 0;
            local_3b8.__fds_bits[0xf] = 0;
            iVar9 = curl_multi_fdset(lVar4,&local_2b8,&local_338,&local_3b8,&local_400);
            uVar1 = _stderr;
            if (iVar9 == 0) {
              iVar9 = 0;
              if (local_400 < -1) {
                curl_mfprintf(_stderr,
                              "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                              ,0x6f);
                iVar9 = 0x7a;
              }
            }
            else {
              uVar5 = curl_multi_strerror(iVar9);
              curl_mfprintf(uVar1,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                            ,0x6f,iVar9,uVar5);
            }
            if (iVar9 == 0) {
              iVar9 = select_wrapper(local_400 + 1,&local_2b8,&local_338,&local_3b8,&local_3e8);
              if (iVar9 == -1) {
                piVar7 = __errno_location();
                iVar9 = *piVar7;
                local_3f0 = _stderr;
                pcVar8 = strerror(iVar9);
                curl_mfprintf(local_3f0,"%s:%d select() failed, with errno %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                              ,0x73,iVar9,pcVar8);
                iVar9 = 0x79;
              }
              else {
                tVar11 = tutil_tvnow();
                lVar10 = tutil_tvdiff(tVar11,tv_test_start);
                iVar2 = 0;
                iVar9 = 0;
                if (60000 < lVar10) {
                  curl_mfprintf(_stderr,
                                "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                                ,0x75);
                  iVar9 = 0x7d;
                  iVar2 = 5;
                }
              }
            }
          }
        }
        else {
          curl_mfprintf(_stderr,
                        "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                        ,0x66);
          iVar9 = 0x7d;
        }
      }
    } while (iVar2 == 0);
    if (iVar2 == 5) break;
    if (iVar2 != 0x32) goto LAB_0010240e;
    wait_ms(1);
    pcVar8 = local_3f8 + 1;
    if (pcVar8 == (char *)0x4) break;
LAB_001026e7:
    local_3f8 = pcVar8;
    iVar2 = curl_multi_add_handle(lVar4,local_3d8[(long)pcVar8]);
    uVar1 = _stderr;
    if (iVar2 != 0) {
      uVar5 = curl_multi_strerror(iVar2);
      curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1506.c"
                    ,0x5a,iVar2,uVar5);
      iVar9 = iVar2;
    }
    if (iVar9 != 0) break;
  }
LAB_00102374:
  lVar10 = 0;
  do {
    lVar6 = local_3d8[lVar10];
    curl_multi_remove_handle(lVar4,lVar6);
    curl_easy_cleanup(lVar6);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  curl_slist_free_all(lVar3);
  curl_multi_cleanup(lVar4);
  curl_global_cleanup();
LAB_0010240e:
  return iVar9;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl[NUM_HANDLES] = {0};
  int running;
  CURLM *m = NULL;
  int i;
  char target_url[256];
  char dnsentry[256];
  struct curl_slist *slist = NULL, *slist2;
  char *port = libtest_arg3;
  char *address = libtest_arg2;

  (void)URL;

  /* Create fake DNS entries for serverX.example.com for all handles */
  for(i = 0; i < NUM_HANDLES; i++) {
    msnprintf(dnsentry, sizeof(dnsentry), "server%d.example.com:%s:%s",
              i + 1, port, address);
    printf("%s\n", dnsentry);
    slist2 = curl_slist_append(slist, dnsentry);
    if(!slist2) {
      fprintf(stderr, "curl_slist_append() failed\n");
      goto test_cleanup;
    }
    slist = slist2;
  }

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(m);

  multi_setopt(m, CURLMOPT_MAXCONNECTS, 3L);

  /* get NUM_HANDLES easy handles */
  for(i = 0; i < NUM_HANDLES; i++) {
    /* get an easy handle */
    easy_init(curl[i]);
    /* specify target */
    msnprintf(target_url, sizeof(target_url),
              "http://server%d.example.com:%s/path/1506%04i",
              i + 1, port, i + 1);
    target_url[sizeof(target_url) - 1] = '\0';
    easy_setopt(curl[i], CURLOPT_URL, target_url);
    /* go verbose */
    easy_setopt(curl[i], CURLOPT_VERBOSE, 1L);
    /* include headers */
    easy_setopt(curl[i], CURLOPT_HEADER, 1L);

    easy_setopt(curl[i], CURLOPT_RESOLVE, slist);
  }

  fprintf(stderr, "Start at URL 0\n");

  for(i = 0; i < NUM_HANDLES; i++) {
    /* add handle to multi */
    multi_add_handle(m, curl[i]);

    for(;;) {
      struct timeval interval;
      fd_set rd, wr, exc;
      int maxfd = -99;

      interval.tv_sec = 1;
      interval.tv_usec = 0;

      multi_perform(m, &running);

      abort_on_test_timeout();

      if(!running)
        break; /* done */

      FD_ZERO(&rd);
      FD_ZERO(&wr);
      FD_ZERO(&exc);

      multi_fdset(m, &rd, &wr, &exc, &maxfd);

      /* At this point, maxfd is guaranteed to be greater or equal than -1. */

      select_test(maxfd + 1, &rd, &wr, &exc, &interval);

      abort_on_test_timeout();
    }
    wait_ms(1); /* to ensure different end times */
  }

test_cleanup:

  /* proper cleanup sequence - type PB */

  for(i = 0; i < NUM_HANDLES; i++) {
    curl_multi_remove_handle(m, curl[i]);
    curl_easy_cleanup(curl[i]);
  }

  curl_slist_free_all(slist);

  curl_multi_cleanup(m);
  curl_global_cleanup();

  return res;
}